

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_muldiv(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 ret;
  TCGv_i64 pTVar1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rs);
  gen_load_gpr(tcg_ctx,t_00,rt);
  if (acc != 0) {
    check_dsp(ctx);
  }
  switch(opc) {
  case 0x18:
    pTVar1 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    ret = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)pTVar1,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)ret,t_00);
    tcg_gen_muls2_i32_mips64el
              (tcg_ctx,(TCGv_i32)pTVar1,(TCGv_i32)ret,(TCGv_i32)pTVar1,(TCGv_i32)ret);
    goto LAB_0088b12a;
  case 0x19:
    pTVar1 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    ret = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)pTVar1,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)ret,t_00);
    tcg_gen_mulu2_i32_mips64el
              (tcg_ctx,(TCGv_i32)pTVar1,(TCGv_i32)ret,(TCGv_i32)pTVar1,(TCGv_i32)ret);
LAB_0088b12a:
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],(TCGv_i32)pTVar1);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],(TCGv_i32)ret);
    break;
  case 0x1a:
    ret = tcg_temp_new_i64(tcg_ctx);
    pTVar1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,ret,t,-0x80000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar1,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar1,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
    tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar1,0);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,ret,pTVar1,ret,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],t,t_00);
    tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],t,t_00);
    goto LAB_0088b050;
  case 0x1b:
    ret = tcg_const_i64_mips64el(tcg_ctx,0);
    pTVar1 = tcg_const_i64_mips64el(tcg_ctx,1);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,ret,pTVar1,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],t,t_00);
    tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],t,t_00);
LAB_0088b050:
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],tcg_ctx->cpu_LO[(uint)acc]);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],tcg_ctx->cpu_HI[(uint)acc]);
    break;
  case 0x1c:
    tcg_gen_muls2_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],tcg_ctx->cpu_HI[(uint)acc],t,t_00)
    ;
    goto LAB_0088b271;
  case 0x1d:
    tcg_gen_mulu2_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],tcg_ctx->cpu_HI[(uint)acc],t,t_00)
    ;
    goto LAB_0088b271;
  case 0x1e:
    ret = tcg_temp_new_i64(tcg_ctx);
    pTVar1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,ret,t,-0x8000000000000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar1,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar1,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
    tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar1,0);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_NE,t_00,ret,pTVar1,ret,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],t,t_00);
    tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],t,t_00);
    break;
  case 0x1f:
    ret = tcg_const_i64_mips64el(tcg_ctx,0);
    pTVar1 = tcg_const_i64_mips64el(tcg_ctx,1);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,ret,pTVar1,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],t,t_00);
    tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],t,t_00);
    break;
  default:
    switch(opc) {
    case 0x70000000:
      ret = tcg_temp_new_i64(tcg_ctx);
      pTVar1 = tcg_temp_new_i64(tcg_ctx);
      break;
    case 0x70000001:
      ret = tcg_temp_new_i64(tcg_ctx);
      pTVar1 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
      break;
    default:
      generate_exception_end(ctx,0x14);
      goto LAB_0088b271;
    case 0x70000004:
      ret = tcg_temp_new_i64(tcg_ctx);
      pTVar1 = tcg_temp_new_i64(tcg_ctx);
      goto LAB_0088ae20;
    case 0x70000005:
      ret = tcg_temp_new_i64(tcg_ctx);
      pTVar1 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
LAB_0088ae20:
      tcg_gen_mov_i64_mips64el(tcg_ctx,ret,t);
      tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar1,t_00);
      tcg_gen_mul_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
      tcg_gen_concat32_i64(tcg_ctx,pTVar1,tcg_ctx->cpu_LO[(uint)acc],tcg_ctx->cpu_HI[(uint)acc]);
      tcg_gen_sub_i64(tcg_ctx,ret,pTVar1,ret);
      goto LAB_0088ae7b;
    }
    tcg_gen_mov_i64_mips64el(tcg_ctx,ret,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar1,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx,ret,ret,pTVar1);
    tcg_gen_concat32_i64(tcg_ctx,pTVar1,tcg_ctx->cpu_LO[(uint)acc],tcg_ctx->cpu_HI[(uint)acc]);
    tcg_gen_add_i64(tcg_ctx,ret,ret,pTVar1);
LAB_0088ae7b:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[(uint)acc],ret);
    gen_move_high32(tcg_ctx,tcg_ctx->cpu_HI[(uint)acc],ret);
    goto LAB_0088b263;
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
LAB_0088b263:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
LAB_0088b271:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_muldiv(DisasContext *ctx, uint32_t opc,
                       int acc, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DMULT:
        tcg_gen_muls2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
    case OPC_DMULTU:
        tcg_gen_mulu2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
#endif
    case OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUB:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUBU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}